

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::fill<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t>
          (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> it,size_t n,
          fill_t<char32_t> *fill)

{
  size_t sVar1;
  char32_t *pcVar2;
  ulong local_48;
  size_t i;
  char32_t *data;
  size_t fill_size;
  fill_t<char32_t> *fill_local;
  size_t n_local;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> it_local;
  
  sVar1 = fill_t<char32_t>::size(fill);
  if (sVar1 == 1) {
    pcVar2 = fill_t<char32_t>::operator[](fill,0);
    it_local = fill_n<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long,char32_t>
                         (it,n,pcVar2);
  }
  else {
    pcVar2 = fill_t<char32_t>::data(fill);
    n_local = (size_t)it.container;
    for (local_48 = 0; local_48 < n; local_48 = local_48 + 1) {
      n_local = (size_t)copy_str<char32_t,char32_t_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                                  (pcVar2,pcVar2 + sVar1,
                                   (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)n_local
                                  );
    }
    it_local.container = (buffer<char32_t> *)n_local;
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)it_local.container;
}

Assistant:

FMT_NOINLINE FMT_CONSTEXPR auto fill(OutputIt it, size_t n,
                                     const fill_t<Char>& fill) -> OutputIt {
  auto fill_size = fill.size();
  if (fill_size == 1) return detail::fill_n(it, n, fill[0]);
  auto data = fill.data();
  for (size_t i = 0; i < n; ++i)
    it = copy_str<Char>(data, data + fill_size, it);
  return it;
}